

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmfont.c
# Opt level: O1

void insert_new_range(BMFONT_PARSER *parser,BMFONT_RANGE *prev,int codepoint)

{
  BMFONT_RANGE *pBVar1;
  BMFONT_CHAR **ppBVar2;
  
  pBVar1 = (BMFONT_RANGE *)
           al_calloc_with_context
                     (1,0x18,0x5d,
                      "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/font/bmfont.c"
                      ,"insert_new_range");
  pBVar1->first = codepoint;
  pBVar1->count = 1;
  ppBVar2 = (BMFONT_CHAR **)
            al_realloc_with_context
                      (pBVar1->characters,8,0x3c,
                       "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/font/bmfont.c"
                       ,"reallocate");
  pBVar1->characters = ppBVar2;
  *ppBVar2 = parser->c;
  if (prev == (BMFONT_RANGE *)0x0) {
    prev = (BMFONT_RANGE *)parser->font->data;
  }
  pBVar1->next = prev->next;
  prev->next = pBVar1;
  return;
}

Assistant:

static void insert_new_range(BMFONT_PARSER *parser, BMFONT_RANGE *prev,
      int codepoint) {
   BMFONT_RANGE *range = al_calloc(1, sizeof *range);
   range->first = codepoint;
   range->count = 1;
   reallocate(range);
   range->characters[0] = parser->c;
   if (prev) {
      range->next = prev->next;
      prev->next = range;
   }
   else {
      ALLEGRO_FONT *font = parser->font;
      BMFONT_DATA *data = font->data;
      range->next = data->range_first;
      data->range_first = range;
   }
}